

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

void __thiscall OpenMD::Thermo::getGyrationalVolume(Thermo *this,RealType *volume,RealType *detI)

{
  Snapshot *this_00;
  RealType RVar1;
  double dVar2;
  double dVar3;
  Vector3d dummyAngMom;
  Mat3x3d intTensor;
  Vector3d local_98;
  Mat3x3d local_78;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if ((this_00->hasInertiaTensor == true) && (this_00->hasGyrationalVolume != false)) {
    RVar1 = Snapshot::getGyrationalVolume(this_00);
    *volume = RVar1;
    Snapshot::getInertiaTensor(&local_78,this_00);
    *detI = (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] *
             local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] -
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]) *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] +
            (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] *
             local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] -
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2]) *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] +
            (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
             local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] -
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0]) *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  }
  else {
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    local_98.super_Vector<double,_3U>.data_[2] = 0.0;
    local_98.super_Vector<double,_3U>.data_[0] = 0.0;
    local_98.super_Vector<double,_3U>.data_[1] = 0.0;
    getInertiaTensor(this,&local_78,&local_98);
    *detI = (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] *
             local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] -
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]) *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] +
            (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] *
             local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] -
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2]) *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] +
            (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
             local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] -
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0]) *
            local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
    dVar2 = pow(1.5 / (double)this->info_->nGlobalIntegrableObjects_,1.5);
    dVar3 = *detI;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar3 = dVar2 * 4.1887902047863905 * dVar3;
    *volume = dVar3;
    Snapshot::setGyrationalVolume(this_00,dVar3);
  }
  return;
}

Assistant:

void Thermo::getGyrationalVolume(RealType& volume, RealType& detI) {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!(snap->hasInertiaTensor && snap->hasGyrationalVolume)) {
      Mat3x3d intTensor;
      Vector3d dummyAngMom;
      RealType sysconstants;
      RealType geomCnst;

      geomCnst = 3.0 / 2.0;
      /* Get the inertia tensor and angular momentum for free*/
      this->getInertiaTensor(intTensor, dummyAngMom);

      detI = intTensor.determinant();
      sysconstants =
          geomCnst / (RealType)(info_->getNGlobalIntegrableObjects());
      volume =
          4.0 / 3.0 * Constants::PI * pow(sysconstants, geomCnst) * sqrt(detI);
      snap->setGyrationalVolume(volume);
    } else {
      volume = snap->getGyrationalVolume();
      detI   = snap->getInertiaTensor().determinant();
    }
    return;
  }